

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::predict<true,false>(gd *g,base_learner *param_2,example *ec)

{
  vw *all;
  float fVar1;
  
  all = g->all;
  fVar1 = trunc_predict(all,ec,all->sd->gravity);
  ec->partial_prediction = fVar1;
  fVar1 = fVar1 * (float)all->sd->contraction;
  ec->partial_prediction = fVar1;
  fVar1 = finalize_prediction(all->sd,fVar1);
  (ec->pred).scalar = fVar1;
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}